

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zesDeviceEnumPerformanceFactorDomains
          (zes_device_handle_t hDevice,uint32_t *pCount,zes_perf_handle_t *phPerf)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  ze_result_t zVar6;
  ze_result_t result;
  ulong uVar7;
  ulong uVar8;
  ze_result_t unaff_R15D;
  bool bVar9;
  ze_result_t local_9c;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zesDeviceEnumPerformanceFactorDomains(hDevice, pCount, phPerf)","")
  ;
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(context + 0x918);
  if (pcVar3 == (code *)0x0) {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(context + 0xd30);
    lVar4 = *(long *)(context + 0xd38);
    uVar7 = lVar4 - lVar2 >> 3;
    bVar9 = lVar4 != lVar2;
    local_9c = unaff_R15D;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar5 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar8 * 8) + 8);
        local_9c = (**(code **)(*plVar5 + 0x5b0))(plVar5,hDevice,pCount,phPerf);
        if (local_9c != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zesDeviceEnumPerformanceFactorDomains",local_9c);
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar1 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
        local_9c = unaff_R15D;
      } while (lVar1 != 0);
    }
    if (bVar9) {
      return local_9c;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar6 = ZESHandleLifetimeValidation::zesDeviceEnumPerformanceFactorDomainsPrologue
                          ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),hDevice,
                           pCount,phPerf), zVar6 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zesDeviceEnumPerformanceFactorDomains",zVar6);
      return zVar6;
    }
    zVar6 = (*pcVar3)(hDevice,pCount,phPerf);
    bVar9 = lVar4 != lVar2;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar5 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar8 * 8) + 8);
        result = (**(code **)(*plVar5 + 0x5b8))(plVar5,hDevice,pCount,phPerf,zVar6);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zesDeviceEnumPerformanceFactorDomains",result);
          local_9c = result;
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar2 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar2 != 0);
    }
    if (bVar9) {
      return local_9c;
    }
  }
  logAndPropagateResult("zesDeviceEnumPerformanceFactorDomains",zVar6);
  return zVar6;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceEnumPerformanceFactorDomains(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t* pCount,                               ///< [in,out] pointer to the number of components of this type.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of components of this type that are available.
                                                        ///< if count is greater than the number of components of this type that
                                                        ///< are available, then the driver shall update the value with the correct
                                                        ///< number of components.
        zes_perf_handle_t* phPerf                       ///< [in,out][optional][range(0, *pCount)] array of handle of components of
                                                        ///< this type.
                                                        ///< if count is less than the number of components of this type that are
                                                        ///< available, then the driver shall only retrieve that number of
                                                        ///< component handles.
        )
    {
        context.logger->log_trace("zesDeviceEnumPerformanceFactorDomains(hDevice, pCount, phPerf)");

        auto pfnEnumPerformanceFactorDomains = context.zesDdiTable.Device.pfnEnumPerformanceFactorDomains;

        if( nullptr == pfnEnumPerformanceFactorDomains )
            return logAndPropagateResult("zesDeviceEnumPerformanceFactorDomains", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDeviceEnumPerformanceFactorDomainsPrologue( hDevice, pCount, phPerf );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDeviceEnumPerformanceFactorDomains", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesDeviceEnumPerformanceFactorDomainsPrologue( hDevice, pCount, phPerf );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDeviceEnumPerformanceFactorDomains", result);
        }

        auto driver_result = pfnEnumPerformanceFactorDomains( hDevice, pCount, phPerf );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDeviceEnumPerformanceFactorDomainsEpilogue( hDevice, pCount, phPerf ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDeviceEnumPerformanceFactorDomains", result);
        }

        return logAndPropagateResult("zesDeviceEnumPerformanceFactorDomains", driver_result);
    }